

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s3_align.c
# Opt level: O2

void align_sen_active(uint8 *senlist,int32 n_sen)

{
  ulong uVar1;
  snode_t **ppsVar2;
  long lVar3;
  ulong uVar4;
  
  uVar1 = 0;
  uVar4 = (ulong)(uint)n_sen;
  if (n_sen < 1) {
    uVar4 = uVar1;
  }
  for (; ppsVar2 = cur_active, uVar4 != uVar1; uVar1 = uVar1 + 1) {
    senlist[uVar1] = '\0';
  }
  while( true ) {
    if (*ppsVar2 == (snode_t *)0x0) {
      return;
    }
    lVar3 = (long)(*ppsVar2)->sen;
    if (lVar3 < 0) break;
    senlist[lVar3] = '\x01';
    ppsVar2 = ppsVar2 + 1;
  }
  __assert_fail("IS_S3SENID(cur_active[i]->sen)",
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/s3_align.c"
                ,0x3f6,"void align_sen_active(uint8 *, int32)");
}

Assistant:

void
align_sen_active(uint8 * senlist, int32 n_sen)
{
    int32 i, sen;

    for (sen = 0; sen < n_sen; sen++)
        senlist[sen] = 0;

    for (i = 0; cur_active[i]; i++) {
        assert(IS_S3SENID(cur_active[i]->sen));
        senlist[cur_active[i]->sen] = 1;
    }
}